

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

byte * __thiscall nuraft::buffer::get_bytes(buffer *this,size_t *len)

{
  uint uVar1;
  ulong uVar2;
  overflow_error *this_00;
  uint uVar3;
  long lVar4;
  int iVar5;
  buffer *pbVar6;
  
  uVar1 = *(uint *)this;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  uVar2 = (ulong)(uVar1 >> 0x10);
  if ((int)uVar1 < 0) {
    uVar2 = (ulong)*(uint *)(this + 4);
    if ((uVar3 & uVar1) - uVar2 < 4) goto LAB_00184be6;
    lVar4 = 8;
  }
  else {
    if ((uVar3 & uVar1) - uVar2 < 4) {
LAB_00184be6:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                (this_00,"insufficient buffer available for a bytes length (int32)");
      goto LAB_00184c1c;
    }
    lVar4 = 4;
  }
  pbVar6 = this + uVar2 + lVar4;
  iVar5 = 0;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    iVar5 = iVar5 + ((uint)(byte)*pbVar6 << ((byte)lVar4 & 0x1f));
    pbVar6 = pbVar6 + 1;
  }
  if ((int)uVar1 < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + 4;
  }
  else {
    *(short *)(this + 2) = (short)(uVar1 >> 0x10) + 4;
  }
  uVar2 = (ulong)iVar5;
  *len = uVar2;
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = *(uint *)(this + 4);
    if (uVar2 <= (ulong)(uVar1 & 0x7fffffff) - (ulong)uVar3) {
      *(uint *)(this + 4) = iVar5 + uVar3;
      return (byte *)(this + (ulong)uVar3 + 8);
    }
  }
  else if (uVar2 <= (ulong)(uVar1 & 0xffff) - (ulong)(uVar1 >> 0x10)) {
    *(short *)(this + 2) = (short)(uVar1 >> 0x10) + (short)iVar5;
    return (byte *)(this + (ulong)(uVar1 >> 0x10) + 4);
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer available for a byte array");
LAB_00184c1c:
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}